

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_compare.cpp
# Opt level: O0

void __thiscall
ktx::CommandCompare::compareKVD(CommandCompare *this,PrintDiff *diff,InputStreams *streams)

{
  uint uVar1;
  ktx_uint32_t kVar2;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  ulong uVar3;
  bool bVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  uchar *puVar8;
  _Self *__x_01;
  pointer ppVar9;
  array<ktx::InputStream,_2UL> *in_RDX;
  CommandCompare *in_RDI;
  undefined1 *puVar10;
  pair<std::_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>,_bool>
  pVar11;
  size_t i_1;
  bool ignoreKey;
  iterator it [2];
  ktx_uint32_t keyLen;
  char *key;
  ktxHashListEntry *entry;
  uint32_t entryIndex;
  ktx_error_code_e result;
  ktxHashList kvDataHead;
  size_t i;
  map<std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>_>
  keys [2];
  vector<unsigned_char,_std::allocator<unsigned_char>_> keyValueStores [2];
  string *in_stack_fffffffffffffbc8;
  array<ktx::InputStream,_2UL> *in_stack_fffffffffffffbd0;
  _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>
  *in_stack_fffffffffffffbd8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffbe0;
  size_t in_stack_fffffffffffffbe8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffbf0;
  allocator<char> *in_stack_fffffffffffffc00;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffc08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc10;
  undefined1 *local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc30;
  char (*in_stack_fffffffffffffc38) [34];
  undefined8 in_stack_fffffffffffffc40;
  Reporter *in_stack_fffffffffffffc48;
  bool local_381;
  bool local_371;
  bool local_349;
  bool local_33a;
  bool local_309;
  bool local_2e9;
  undefined1 *local_268;
  undefined1 *local_250;
  _Self local_1f8;
  _Self local_1f0;
  _Base_ptr local_1e8;
  size_t local_1e0;
  char *local_1d8;
  size_t local_1d0;
  char *local_1c8;
  _Self local_1c0;
  _Self local_1b8;
  _Base_ptr local_1b0;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_1a8;
  byte local_19b;
  byte local_19a;
  allocator<char> local_199;
  string local_198 [32];
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_178;
  _Self local_170;
  ulong local_168;
  byte local_159;
  _Self local_158;
  _Self local_150;
  _Self local_148 [2];
  _Base_ptr local_138;
  undefined1 local_130;
  undefined1 local_124 [4];
  undefined1 local_120 [8];
  long local_118;
  uint local_110;
  int local_10c;
  long local_108;
  string *local_100;
  array<ktx::InputStream,_2UL> *paStack_f8;
  ulong local_f0;
  undefined1 local_e8 [96];
  undefined1 local_88 [48];
  undefined1 auStack_58 [31];
  allocator<char> local_39;
  string local_38 [32];
  array<ktx::InputStream,_2UL> *local_18;
  
  if (((in_RDI->options).super_OptionsCompare.ignoreAllMetadata & 1U) == 0) {
    local_18 = in_RDX;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc10,(char *)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00
              );
    PrintDiff::setContext((PrintDiff *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator(&local_39);
    local_250 = local_88;
    do {
      memset(local_250,0,0x18);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x15c83e);
      local_250 = local_250 + 0x18;
    } while (local_250 != auStack_58);
    local_268 = local_e8;
    do {
      memset(local_268,0,0x30);
      std::
      map<std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>_>
      ::map((map<std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>_>
             *)0x15c8ac);
      local_268 = local_268 + 0x30;
    } while (local_268 != local_88);
    for (local_f0 = 0; uVar3 = local_f0, sVar5 = std::array<ktx::InputStream,_2UL>::size(local_18),
        uVar3 < sVar5; local_f0 = local_f0 + 1) {
      pvVar6 = std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[]
                         (&in_RDI->headers,local_f0);
      if ((pvVar6->keyValueData).byteLength != 0) {
        std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[]
                  (&in_RDI->headers,local_f0);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
        pvVar7 = std::array<ktx::InputStream,_2UL>::operator[]
                           (in_stack_fffffffffffffbd0,(size_type)in_stack_fffffffffffffbc8);
        pvVar6 = std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[]
                           (&in_RDI->headers,local_f0);
        uVar1 = (pvVar6->keyValueData).byteOffset;
        puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x15ca23);
        std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[]
                  (&in_RDI->headers,local_f0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffbe0,(char *)in_stack_fffffffffffffbd8);
        in_stack_fffffffffffffbc8 = local_100;
        in_stack_fffffffffffffbd0 = paStack_f8;
        read(in_RDI,(int)pvVar7,(void *)(ulong)uVar1,(size_t)puVar8);
        local_108 = 0;
        pvVar6 = std::vector<KTX_header2,_std::allocator<KTX_header2>_>::operator[]
                           (&in_RDI->headers,local_f0);
        kVar2 = (pvVar6->keyValueData).byteLength;
        puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x15cae7);
        local_10c = ktxHashList_Deserialize(&local_108,kVar2,puVar8);
        if (local_10c != 0) {
          pvVar7 = std::array<ktx::InputStream,_2UL>::operator[]
                             (in_stack_fffffffffffffbd0,(size_type)in_stack_fffffffffffffbc8);
          InputStream::str_abi_cxx11_(pvVar7);
          Reporter::fatal<char_const(&)[34],std::__cxx11::string_const&>
                    (in_stack_fffffffffffffc48,
                     (ReturnCode)((ulong)in_stack_fffffffffffffc40 >> 0x20),
                     in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
        }
        if (local_108 != 0) {
          local_118 = local_108;
          for (local_110 = 0; local_118 != 0 && local_110 < 100; local_110 = local_110 + 1) {
            ktxHashListEntry_GetKey(local_118,local_124,local_120);
            pVar11 = std::
                     map<std::basic_string_view<char,std::char_traits<char>>,ktxKVListEntry*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,ktxKVListEntry*>>>
                     ::emplace<char*&,ktxKVListEntry*&>
                               ((map<std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>_>
                                 *)in_stack_fffffffffffffbe0,(char **)in_stack_fffffffffffffbd8,
                                (ktxKVListEntry **)in_stack_fffffffffffffbd0);
            local_138 = (_Base_ptr)pVar11.first._M_node;
            local_130 = pVar11.second;
            local_118 = ktxHashList_Next(local_118);
          }
        }
      }
    }
    local_148[0]._M_node =
         (_Base_ptr)
         std::
         map<std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>_>
         ::begin((map<std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>_>
                  *)in_stack_fffffffffffffbc8);
    local_148[1]._M_node =
         (_Base_ptr)
         std::
         map<std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>_>
         ::begin((map<std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>_>
                  *)in_stack_fffffffffffffbc8);
    while( true ) {
      local_150._M_node =
           (_Base_ptr)
           std::
           map<std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>_>
           ::end((map<std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>_>
                  *)in_stack_fffffffffffffbc8);
      bVar4 = std::operator!=(local_148,&local_150);
      local_2e9 = true;
      if (!bVar4) {
        local_158._M_node =
             (_Base_ptr)
             std::
             map<std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>_>
             ::end((map<std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>_>
                    *)in_stack_fffffffffffffbc8);
        local_2e9 = std::operator!=(local_148 + 1,&local_158);
      }
      if (local_2e9 == false) break;
      local_159 = 0;
      for (local_168 = 0; uVar3 = local_168,
          sVar5 = std::array<ktx::InputStream,_2UL>::size(local_18), uVar3 < sVar5;
          local_168 = local_168 + 1) {
        __x_01 = local_148 + local_168;
        local_170._M_node =
             (_Base_ptr)
             std::
             map<std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>_>
             ::end((map<std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>_>
                    *)in_stack_fffffffffffffbc8);
        bVar4 = std::operator!=(__x_01,&local_170);
        local_19a = 0;
        local_19b = 0;
        local_309 = false;
        if (bVar4) {
          std::
          _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>
          ::operator->((_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>
                        *)0x15ce87);
          std::allocator<char>::allocator();
          local_19a = 1;
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
          local_19b = 1;
          local_178._M_cur =
               (__node_type *)
               std::
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffbc8,(key_type *)0x15cee8);
          local_1a8._M_cur =
               (__node_type *)
               std::
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffbc8);
          local_309 = std::__detail::operator!=(&local_178,&local_1a8);
        }
        if ((local_19b & 1) != 0) {
          std::__cxx11::string::~string(local_198);
        }
        if ((local_19a & 1) != 0) {
          std::allocator<char>::~allocator(&local_199);
        }
        if (local_309 != false) {
          local_1b0 = (_Base_ptr)
                      std::
                      _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>
                      ::operator++(in_stack_fffffffffffffbd8,
                                   (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
          local_159 = 1;
          break;
        }
      }
      if ((local_159 & 1) == 0) {
        local_1b8._M_node =
             (_Base_ptr)
             std::
             map<std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>_>
             ::end((map<std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>_>
                    *)in_stack_fffffffffffffbc8);
        bVar4 = std::operator!=(local_148,&local_1b8);
        local_33a = false;
        if (bVar4) {
          local_1c0._M_node =
               (_Base_ptr)
               std::
               map<std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>_>
               ::end((map<std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>_>
                      *)in_stack_fffffffffffffbc8);
          bVar4 = std::operator==(local_148 + 1,&local_1c0);
          local_349 = true;
          if (!bVar4) {
            ppVar9 = std::
                     _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>
                     ::operator->((_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>
                                   *)0x15d0fa);
            local_1d0 = (ppVar9->first)._M_len;
            local_1c8 = (ppVar9->first)._M_str;
            ppVar9 = std::
                     _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>
                     ::operator->((_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>
                                   *)0x15d122);
            local_1e0 = (ppVar9->first)._M_len;
            local_1d8 = (ppVar9->first)._M_str;
            __x._M_str = (char *)in_stack_fffffffffffffbf0;
            __x._M_len = in_stack_fffffffffffffbe8;
            __y._M_str = (char *)in_stack_fffffffffffffbe0;
            __y._M_len = (size_t)in_stack_fffffffffffffbd8;
            local_349 = std::operator<(__x,__y);
          }
          local_33a = local_349;
        }
        if (local_33a == false) {
          local_1f0._M_node =
               (_Base_ptr)
               std::
               map<std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>_>
               ::end((map<std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>_>
                      *)in_stack_fffffffffffffbc8);
          bVar4 = std::operator!=(local_148 + 1,&local_1f0);
          local_371 = false;
          if (bVar4) {
            local_1f8._M_node =
                 (_Base_ptr)
                 std::
                 map<std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>_>
                 ::end((map<std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>_>
                        *)in_stack_fffffffffffffbc8);
            bVar4 = std::operator==(local_148,&local_1f8);
            local_381 = true;
            if (!bVar4) {
              std::
              _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>
              ::operator->((_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>
                            *)0x15d2ac);
              std::
              _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>
              ::operator->((_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>
                            *)0x15d2d4);
              __x_00._M_str = (char *)in_stack_fffffffffffffbf0;
              __x_00._M_len = in_stack_fffffffffffffbe8;
              __y_00._M_str = (char *)in_stack_fffffffffffffbe0;
              __y_00._M_len = (size_t)in_stack_fffffffffffffbd8;
              local_381 = std::operator>(__x_00,__y_00);
            }
            local_371 = local_381;
          }
          if (local_371 == false) {
            std::
            _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>
            ::operator->((_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>
                          *)0x15d3d5);
            std::
            _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>
            ::operator->((_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>
                          *)0x15d3e7);
            std::
            _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>
            ::operator->((_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>
                          *)0x15d400);
            compareKVEntry((CommandCompare *)
                           keys[1]._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,
                           (PrintDiff *)keys[1]._M_t._M_impl._0_8_,
                           (string_view *)keys[0]._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           (ktxHashListEntry *)
                           keys[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
                           (ktxHashListEntry *)
                           keys[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
            std::
            _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>
            ::operator++(in_stack_fffffffffffffbd8,(int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
            std::
            _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>
            ::operator++(in_stack_fffffffffffffbd8,(int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
          }
          else {
            std::
            _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>
            ::operator->((_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>
                          *)0x15d35a);
            std::
            _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>
            ::operator->((_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>
                          *)0x15d36f);
            compareKVEntry((CommandCompare *)
                           keys[1]._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,
                           (PrintDiff *)keys[1]._M_t._M_impl._0_8_,
                           (string_view *)keys[0]._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           (ktxHashListEntry *)
                           keys[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
                           (ktxHashListEntry *)
                           keys[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
            std::
            _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>
            ::operator++(in_stack_fffffffffffffbd8,(int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
          }
        }
        else {
          std::
          _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>
          ::operator->((_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>
                        *)0x15d1a5);
          std::
          _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>
          ::operator->((_Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>
                        *)0x15d1ba);
          compareKVEntry((CommandCompare *)
                         keys[1]._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,
                         (PrintDiff *)keys[1]._M_t._M_impl._0_8_,
                         (string_view *)keys[0]._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (ktxHashListEntry *)
                         keys[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
                         (ktxHashListEntry *)
                         keys[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
          local_1e8 = (_Base_ptr)
                      std::
                      _Rb_tree_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>
                      ::operator++(in_stack_fffffffffffffbd8,
                                   (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20));
        }
      }
    }
    puVar10 = local_88;
    do {
      puVar10 = puVar10 + -0x30;
      std::
      map<std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>_>
      ::~map((map<std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_ktxKVListEntry_*>_>_>
              *)0x15d48a);
    } while (puVar10 != local_e8);
    puVar10 = local_88;
    local_3e8 = auStack_58;
    do {
      local_3e8 = local_3e8 + -0x18;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbe0)
      ;
    } while (local_3e8 != puVar10);
  }
  return;
}

Assistant:

void CommandCompare::compareKVD(PrintDiff& diff, InputStreams& streams) {
    if (options.ignoreAllMetadata) return;

    diff.setContext("Key/Value Data\n\n");

    std::vector<uint8_t> keyValueStores[2] = {};
    std::map<std::string_view, ktxHashListEntry*> keys[2] = {};

    for (std::size_t i = 0; i < streams.size(); ++i) {
        if (headers[i].keyValueData.byteLength == 0) continue;

        keyValueStores[i].resize(headers[i].keyValueData.byteLength);
        read(streams[i], headers[i].keyValueData.byteOffset, keyValueStores[i].data(),
            headers[i].keyValueData.byteLength, "the KVD");

        ktxHashList kvDataHead = nullptr;
        KTX_error_code result = ktxHashList_Deserialize(&kvDataHead,
            headers[i].keyValueData.byteLength, keyValueStores[i].data());
        if (result != KTX_SUCCESS)
            fatal(rc::KTX_FAILURE, "Failed to parse KVD in file \"{}\".", streams[i].str());

        if (kvDataHead == nullptr)
            continue;

        uint32_t entryIndex = 0;
        ktxHashListEntry* entry = kvDataHead;
        for (; entry != NULL && entryIndex < MAX_NUM_KV_ENTRIES; entry = ktxHashList_Next(entry), ++entryIndex) {
            char* key;
            ktx_uint32_t keyLen;
            ktxHashListEntry_GetKey(entry, &keyLen, &key);
            keys[i].emplace(key, entry);
        }
    }

    std::map<std::string_view, ktxHashListEntry*>::iterator it[2] = { keys[0].begin(), keys[1].begin() };
    while (it[0] != keys[0].end() || it[1] != keys[1].end()) {
        bool ignoreKey = false;
        for (std::size_t i = 0; i < streams.size(); ++i)
            if ((it[i] != keys[i].end()) &&
                (options.ignoreMetadataKeys.find(std::string(it[i]->first)) != options.ignoreMetadataKeys.end())) {
                // Key is on the ignore list, skip it
                it[i]++;
                ignoreKey = true;
                break;
            }
        if (ignoreKey) continue;

        if ((it[0] != keys[0].end()) && ((it[1] == keys[1].end()) || (it[0]->first < it[1]->first))) {
            // First stream has a key that is not present in the second stream
            compareKVEntry(diff, it[0]->first, it[0]->second, nullptr);
            it[0]++;
        } else if ((it[1] != keys[1].end()) && ((it[0] == keys[0].end()) || (it[0]->first > it[1]->first))) {
            // Second stream has a key that is not present in the first stream
            compareKVEntry(diff, it[1]->first, nullptr, it[1]->second);
            it[1]++;
        } else {
            // Both streams have the key
            compareKVEntry(diff, it[0]->first, it[0]->second, it[1]->second);
            it[0]++;
            it[1]++;
        }
    }
}